

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont_p.h
# Opt level: O0

void __thiscall QRawFontPrivate::QRawFontPrivate(QRawFontPrivate *this,QRawFontPrivate *other)

{
  QAtomicInt *in_RSI;
  long *in_RDI;
  
  *in_RDI = *(long *)in_RSI;
  *(__int_type *)(in_RDI + 1) =
       in_RSI[2].super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i;
  QAtomicInt::QAtomicInt(in_RSI,(int)((ulong)in_RDI >> 0x20));
  in_RDI[2] = *(long *)(in_RSI + 4);
  if (*in_RDI != 0) {
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x793013);
  }
  return;
}

Assistant:

QRawFontPrivate(const QRawFontPrivate &other)
        : fontEngine(other.fontEngine)
        , hintingPreference(other.hintingPreference)
        , thread(other.thread)
    {
#ifndef QT_NO_DEBUG
        Q_ASSERT(fontEngine == nullptr || thread == QThread::currentThread());
#endif
        if (fontEngine != nullptr)
            fontEngine->ref.ref();
    }